

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_args_DEFx(Context_conflict *ctx,int isflt)

{
  int iVar1;
  
  parse_destination_token(ctx);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  require_comma(ctx);
  iVar1 = ctx->tokenbufpos;
  ctx->tokenbufpos = iVar1 + 1;
  iVar1 = parse_num(ctx,isflt,ctx->tokenbuf + iVar1);
  return iVar1;
}

Assistant:

static int parse_args_DEFx(Context *ctx, const int isflt)
{
    parse_destination_token(ctx);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    require_comma(ctx);
    parse_num(ctx, isflt, &ctx->tokenbuf[ctx->tokenbufpos++]);
    return 6;
}